

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O1

void TTD::NSLogEvents::
     JsRTVarAndIntegralArgumentsAction_InternalUse_Emit<(TTD::NSLogEvents::EventKind)57,1ul,2ul>
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  long lVar1;
  long lVar2;
  
  if (evt->EventKind == DeletePropertyActionTag) {
    (*writer->_vptr_FileWriter[3])(writer,0x12,1);
    lVar2 = 0;
    NSSnapValues::EmitTTDVar(*(TTDVar *)(evt + 1),writer,NoSeparator);
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    NSSnapValues::EmitTTDVar((TTDVar)evt[1].EventTimeStamp,writer,NoSeparator);
    do {
      lVar1 = lVar2 * 2;
      lVar2 = lVar2 + 1;
      (*writer->_vptr_FileWriter[0xf])(writer,*(undefined8 *)(&evt[2].EventKind + lVar1),1);
    } while (lVar2 == 1);
    (*writer->_vptr_FileWriter[5])(writer,0);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void JsRTVarAndIntegralArgumentsAction_InternalUse_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const JsRTVarAndIntegralArgumentsAction_InternalUse<vcount, icount>* vAction = GetInlineEventDataAs<JsRTVarAndIntegralArgumentsAction_InternalUse<vcount, icount>, tag>(evt);

            writer->WriteKey(NSTokens::Key::argRetVal, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(vAction->Result, writer, NSTokens::Separator::NoSeparator);

            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(size_t i = 0; i < vcount; ++i)
            {
                NSSnapValues::EmitTTDVar(vAction->VarArray[i], writer, i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }

            for(size_t i = 0; i < icount; ++i)
            {
                writer->WriteNakedInt64(vAction->ScalarArray[i], vcount + i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();
        }